

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
          *field)

{
  FuncTypeModuleField *pFVar1;
  FuncType *local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  _Head_base<0UL,_wabt::FuncTypeModuleField_*,_false> local_28;
  
  pFVar1 = (field->_M_t).
           super___uniq_ptr_impl<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::FuncTypeModuleField_*,_std::default_delete<wabt::FuncTypeModuleField>_>
           .super__Head_base<0UL,_wabt::FuncTypeModuleField_*,_false>._M_head_impl;
  if ((pFVar1->func_type).name._M_string_length != 0) {
    local_58 = (FuncType *)
               (pFVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField.loc.
               filename.data_;
    uStack_50 = (undefined4)
                (pFVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField.loc.
                filename.size_;
    uStack_4c = *(undefined4 *)
                 ((long)&(pFVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).
                         super_ModuleField.loc.filename.size_ + 4);
    local_48 = (pFVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField.loc.
               field_1.field_0.line;
    iStack_44 = (pFVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField.loc.
                field_1.field_0.first_column;
    iStack_40 = (pFVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField.loc.
                field_1.field_0.last_column;
    uStack_3c = *(undefined4 *)
                 ((long)&(pFVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).
                         super_ModuleField.loc.field_1 + 0xc);
    local_38 = (undefined4)
               ((ulong)((long)(this->func_types).
                              super__Vector_base<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->func_types).
                             super__Vector_base<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
    ::_M_emplace<std::__cxx11::string&,wabt::Binding>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                *)&this->func_type_bindings,&pFVar1->func_type);
  }
  local_58 = &pFVar1->func_type;
  std::vector<wabt::FuncType*,std::allocator<wabt::FuncType*>>::emplace_back<wabt::FuncType*>
            ((vector<wabt::FuncType*,std::allocator<wabt::FuncType*>> *)&this->func_types,&local_58)
  ;
  local_28._M_head_impl =
       (field->_M_t).
       super___uniq_ptr_impl<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
       ._M_t.
       super__Tuple_impl<0UL,_wabt::FuncTypeModuleField_*,_std::default_delete<wabt::FuncTypeModuleField>_>
       .super__Head_base<0UL,_wabt::FuncTypeModuleField_*,_false>._M_head_impl;
  (field->_M_t).
  super___uniq_ptr_impl<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>.
  _M_t.
  super__Tuple_impl<0UL,_wabt::FuncTypeModuleField_*,_std::default_delete<wabt::FuncTypeModuleField>_>
  .super__Head_base<0UL,_wabt::FuncTypeModuleField_*,_false>._M_head_impl =
       (FuncTypeModuleField *)0x0;
  intrusive_list<wabt::ModuleField>::push_back
            (&this->fields,
             (unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> *)&local_28);
  if (local_28._M_head_impl != (FuncTypeModuleField *)0x0) {
    (*((local_28._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  return;
}

Assistant:

void Module::AppendField(std::unique_ptr<FuncTypeModuleField> field) {
  FuncType& func_type = field->func_type;
  if (!func_type.name.empty()) {
    func_type_bindings.emplace(func_type.name,
                               Binding(field->loc, func_types.size()));
  }
  func_types.push_back(&func_type);
  fields.push_back(std::move(field));
}